

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void srecmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *C_00;
  double *C_01;
  double *C_02;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  void *pvVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  uint p_00;
  double *pdVar14;
  double *pdVar15;
  uint m_00;
  double *pdVar16;
  double *pdVar17;
  uint n_00;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  size_t __size;
  size_t __size_00;
  size_t __size_01;
  double dVar22;
  double *local_a8;
  
  if (n + m + p < 0xc1) {
    if (0 < m) {
      uVar11 = 0;
      do {
        if (0 < p) {
          uVar21 = 0;
          pdVar9 = B;
          do {
            dVar22 = 0.0;
            if (0 < n) {
              uVar20 = 0;
              pdVar8 = pdVar9;
              do {
                dVar22 = dVar22 + A[uVar20] * *pdVar8;
                uVar20 = uVar20 + 1;
                pdVar8 = pdVar8 + sB;
              } while ((uint)n != uVar20);
            }
            C[uVar11 * (long)sC + uVar21] = dVar22;
            uVar21 = uVar21 + 1;
            pdVar9 = pdVar9 + 1;
          } while (uVar21 != (uint)p);
        }
        uVar11 = uVar11 + 1;
        A = A + sA;
      } while (uVar11 != (uint)m);
    }
    return;
  }
  m_00 = m / 2;
  n_00 = n / 2;
  uVar21 = (ulong)n_00;
  p_00 = p / 2;
  uVar11 = (ulong)p_00;
  lVar1 = (long)(int)n_00;
  pdVar9 = A + lVar1;
  lVar2 = (long)(int)(m_00 * sA);
  local_a8 = pdVar9 + lVar2;
  lVar3 = (long)(int)p_00;
  pdVar8 = B + lVar3;
  lVar4 = (long)(int)(n_00 * sB);
  __size = (long)(int)m_00 * 8 * lVar3;
  C_00 = (double *)malloc(__size);
  C_01 = (double *)malloc(__size);
  C_02 = (double *)malloc(__size);
  __size_01 = (long)(int)m_00 * 8 * lVar1;
  pdVar5 = (double *)malloc(__size_01);
  __size_00 = lVar1 * lVar3 * 8;
  pdVar6 = (double *)malloc(__size_00);
  if (1 < m) {
    uVar20 = 0;
    pdVar16 = A;
    pdVar14 = local_a8;
    pdVar7 = pdVar5;
    do {
      if (1 < n) {
        uVar18 = 0;
        do {
          pdVar7[uVar18] = pdVar16[uVar18] + pdVar14[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      uVar20 = uVar20 + 1;
      pdVar7 = pdVar7 + lVar1;
      pdVar14 = pdVar14 + sA;
      pdVar16 = pdVar16 + sA;
    } while (uVar20 != m_00);
  }
  pdVar16 = pdVar8 + lVar4;
  if (1 < n) {
    lVar13 = 0;
    pdVar14 = B;
    pdVar7 = pdVar16;
    pdVar12 = pdVar6;
    do {
      if (1 < p) {
        uVar20 = 0;
        do {
          pdVar12[uVar20] = pdVar14[uVar20] + pdVar7[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      lVar13 = lVar13 + 1;
      pdVar12 = pdVar12 + lVar3;
      pdVar7 = pdVar7 + sB;
      pdVar14 = pdVar14 + sB;
    } while (lVar13 != lVar1);
  }
  pdVar14 = C + (int)(m_00 * sC);
  srecmult(pdVar5,pdVar6,C_00,m_00,n_00,p_00,n_00,p_00,p_00);
  free(pdVar5);
  free(pdVar6);
  pdVar5 = (double *)malloc(__size_01);
  if (1 < m) {
    pdVar6 = A + lVar2;
    uVar20 = 0;
    pdVar7 = local_a8;
    pdVar12 = pdVar5;
    do {
      if (1 < n) {
        uVar18 = 0;
        do {
          pdVar12[uVar18] = pdVar6[uVar18] + pdVar7[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      uVar20 = uVar20 + 1;
      pdVar12 = pdVar12 + lVar1;
      pdVar7 = pdVar7 + sA;
      pdVar6 = pdVar6 + sA;
    } while (uVar20 != m_00);
  }
  srecmult(pdVar5,B,pdVar14,m_00,n_00,p_00,n_00,sB,sC);
  free(pdVar5);
  pdVar5 = (double *)malloc(__size_00);
  if (1 < n) {
    lVar13 = 0;
    pdVar6 = pdVar8;
    pdVar7 = pdVar16;
    pdVar12 = pdVar5;
    do {
      if (1 < p) {
        uVar20 = 0;
        do {
          pdVar12[uVar20] = pdVar6[uVar20] - pdVar7[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      lVar13 = lVar13 + 1;
      pdVar12 = pdVar12 + lVar3;
      pdVar7 = pdVar7 + sB;
      pdVar6 = pdVar6 + sB;
    } while (lVar13 != lVar1);
  }
  srecmult(A,pdVar5,C_01,m_00,n_00,p_00,sA,p_00,p_00);
  free(pdVar5);
  pdVar5 = (double *)malloc(__size_00);
  if (1 < n) {
    lVar13 = 0;
    pdVar6 = B;
    pdVar7 = pdVar5;
    do {
      if (1 < p) {
        uVar20 = 0;
        do {
          pdVar7[uVar20] = pdVar6[lVar4 + uVar20] - pdVar6[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      lVar13 = lVar13 + 1;
      pdVar7 = pdVar7 + lVar3;
      pdVar6 = pdVar6 + sB;
    } while (lVar13 != lVar1);
  }
  pdVar6 = C + lVar3;
  srecmult(local_a8,pdVar5,C_02,m_00,n_00,p_00,sA,p_00,p_00);
  free(pdVar5);
  pdVar5 = (double *)malloc(__size_01);
  if (1 < m) {
    uVar20 = 0;
    pdVar7 = A;
    pdVar12 = pdVar9;
    pdVar15 = pdVar5;
    do {
      if (1 < n) {
        uVar18 = 0;
        do {
          pdVar15[uVar18] = pdVar7[uVar18] + pdVar12[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      uVar20 = uVar20 + 1;
      pdVar15 = pdVar15 + lVar1;
      pdVar12 = pdVar12 + sA;
      pdVar7 = pdVar7 + sA;
    } while (uVar20 != m_00);
  }
  srecmult(pdVar5,pdVar16,pdVar6,m_00,n_00,p_00,n_00,sB,sC);
  free(pdVar5);
  pdVar5 = (double *)malloc(__size_01);
  pdVar7 = (double *)malloc(__size_00);
  if (1 < m) {
    uVar20 = 0;
    pdVar12 = pdVar5;
    do {
      if (1 < n) {
        uVar18 = 0;
        do {
          pdVar12[uVar18] = A[lVar2 + uVar18] - A[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      uVar20 = uVar20 + 1;
      pdVar12 = pdVar12 + lVar1;
      A = A + sA;
    } while (uVar20 != m_00);
  }
  pdVar12 = pdVar6 + (int)(m_00 * sC);
  if (1 < n) {
    lVar2 = 0;
    pdVar15 = B;
    pdVar17 = pdVar7;
    do {
      if (1 < p) {
        uVar20 = 0;
        do {
          pdVar17[uVar20] = pdVar15[uVar20] + pdVar8[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      lVar2 = lVar2 + 1;
      pdVar17 = pdVar17 + lVar3;
      pdVar8 = pdVar8 + sB;
      pdVar15 = pdVar15 + sB;
    } while (lVar2 != lVar1);
  }
  srecmult(pdVar5,pdVar7,pdVar12,m_00,n_00,p_00,n_00,p_00,sC);
  free(pdVar5);
  free(pdVar7);
  pdVar8 = (double *)malloc(__size_01);
  pdVar5 = (double *)malloc(__size_00);
  if (1 < m) {
    uVar20 = 0;
    pdVar7 = pdVar8;
    do {
      if (1 < n) {
        uVar18 = 0;
        do {
          pdVar7[uVar18] = pdVar9[uVar18] - local_a8[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      uVar20 = uVar20 + 1;
      pdVar7 = pdVar7 + lVar1;
      local_a8 = local_a8 + sA;
      pdVar9 = pdVar9 + sA;
    } while (uVar20 != m_00);
  }
  if (1 < n) {
    pdVar9 = B + lVar4;
    lVar2 = 0;
    pdVar7 = pdVar5;
    do {
      if (1 < p) {
        uVar21 = 0;
        do {
          pdVar7[uVar21] = pdVar9[uVar21] + pdVar16[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
      }
      lVar2 = lVar2 + 1;
      pdVar7 = pdVar7 + lVar3;
      pdVar16 = pdVar16 + sB;
      pdVar9 = pdVar9 + sB;
    } while (lVar2 != lVar1);
  }
  srecmult(pdVar8,pdVar5,C,m_00,n_00,p_00,n_00,p_00,sC);
  free(pdVar8);
  free(pdVar5);
  pvVar10 = malloc(__size);
  if (1 < m) {
    lVar1 = (long)sC;
    uVar21 = (ulong)m_00;
    uVar20 = 0;
    pdVar9 = C_00;
    pdVar8 = C;
    do {
      if (1 < p) {
        uVar18 = 0;
        do {
          pdVar8[uVar18] = pdVar9[uVar18] + pdVar8[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
      }
      uVar20 = uVar20 + 1;
      pdVar8 = pdVar8 + lVar1;
      pdVar9 = pdVar9 + lVar3;
    } while (uVar20 != uVar21);
    if (1 < m) {
      uVar20 = 0;
      pdVar9 = C_02;
      pdVar8 = pdVar6;
      pvVar19 = pvVar10;
      do {
        if (1 < p) {
          uVar18 = 0;
          do {
            *(double *)((long)pvVar19 + uVar18 * 8) = pdVar9[uVar18] - pdVar8[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
        }
        uVar20 = uVar20 + 1;
        pvVar19 = (void *)((long)pvVar19 + lVar3 * 8);
        pdVar8 = pdVar8 + lVar1;
        pdVar9 = pdVar9 + lVar3;
      } while (uVar20 != uVar21);
      if (1 < m) {
        uVar20 = 0;
        pvVar19 = pvVar10;
        do {
          if (1 < p) {
            uVar18 = 0;
            do {
              C[uVar18] = C[uVar18] + *(double *)((long)pvVar19 + uVar18 * 8);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar20 = uVar20 + 1;
          pvVar19 = (void *)((long)pvVar19 + lVar3 * 8);
          C = C + lVar1;
        } while (uVar20 != uVar21);
      }
    }
  }
  free(pvVar10);
  pvVar10 = malloc(__size);
  if (m < 2) {
LAB_0011ca8a:
    free(pvVar10);
  }
  else {
    lVar1 = (long)sC;
    uVar20 = (ulong)m_00;
    uVar21 = 0;
    pdVar9 = C_00;
    pdVar8 = pdVar12;
    do {
      if (1 < p) {
        uVar18 = 0;
        do {
          pdVar8[uVar18] = pdVar9[uVar18] + pdVar8[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
      }
      uVar21 = uVar21 + 1;
      pdVar8 = pdVar8 + lVar1;
      pdVar9 = pdVar9 + lVar3;
    } while (uVar21 != uVar20);
    if (m < 2) goto LAB_0011ca8a;
    uVar21 = 0;
    pdVar9 = C_01;
    pdVar8 = pdVar14;
    pvVar19 = pvVar10;
    do {
      if (1 < p) {
        uVar18 = 0;
        do {
          *(double *)((long)pvVar19 + uVar18 * 8) = pdVar9[uVar18] - pdVar8[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
      }
      uVar21 = uVar21 + 1;
      pvVar19 = (void *)((long)pvVar19 + lVar3 * 8);
      pdVar8 = pdVar8 + lVar1;
      pdVar9 = pdVar9 + lVar3;
    } while (uVar21 != uVar20);
    if (m < 2) goto LAB_0011ca8a;
    uVar21 = 0;
    pvVar19 = pvVar10;
    do {
      if (1 < p) {
        uVar18 = 0;
        do {
          pdVar12[uVar18] = pdVar12[uVar18] + *(double *)((long)pvVar19 + uVar18 * 8);
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
      }
      uVar21 = uVar21 + 1;
      pvVar19 = (void *)((long)pvVar19 + lVar3 * 8);
      pdVar12 = pdVar12 + lVar1;
    } while (uVar21 != uVar20);
    free(pvVar10);
    if (m < 2) goto LAB_0011caef;
    uVar21 = 0;
    pdVar9 = C_01;
    do {
      if (1 < p) {
        uVar18 = 0;
        do {
          pdVar6[uVar18] = pdVar9[uVar18] + pdVar6[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
      }
      uVar21 = uVar21 + 1;
      pdVar6 = pdVar6 + lVar1;
      pdVar9 = pdVar9 + lVar3;
    } while (uVar21 != uVar20);
  }
  if (1 < m) {
    uVar21 = 0;
    pdVar9 = C_02;
    do {
      if (1 < p) {
        uVar20 = 0;
        do {
          pdVar14[uVar20] = pdVar9[uVar20] + pdVar14[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      uVar21 = uVar21 + 1;
      pdVar14 = pdVar14 + sC;
      pdVar9 = pdVar9 + lVar3;
    } while (uVar21 != m_00);
  }
LAB_0011caef:
  free(C_00);
  free(C_01);
  free(C_02);
  return;
}

Assistant:

void srecmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	register int i,j,k;
	int u,v,t;
	double sum;
	double *A1,*B1;
	double *a11,*a12,*a21,*a22;
	double *b11,*b12,*b21,*b22;
	double *c11,*c12,*c21,*c22;
	double *m1,*m2,*m3,*m4,*m5,*m6,*m7;
	int sm1,sm2,sm3,sm4,sm5,sm6,sm7;
	int sA1,sB1;
	if (m + n + p <= CUTOFF) {
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sA;
				u = i * sC;
				t = j + u;
				sum = 0.;
				for (k = 0; k < n;++k) {
					sum += A[k + v] * B[j + k * sB];
				}
				C[t] = sum;
			}
		}

		
	} else {
		m/=2;n/=2;p/=2;
		// A size mXn, C size mXp
		a11 = A;
		a12 = A + n;
		a21 = A + m * sA;
		a22 = A + n + m * sA;
		
		//B size nXp
		
		b11 = B;
		b12 = B + p;
		b21 = B + n * sB;
		b22 = B + p + n * sB;
		
		//C size mXp
		
		c11 = C;
		c12 = C + p;
		c21 = C + m * sC;
		c22 = C + p + m * sC;
		
		// m matrices have dimension m X p each. See http://en.wikipedia.org/wiki/Strassen_algorithm
		
		m1 = (double*) malloc(sizeof(double) *m * p);
		sm1 = p;
		
		m3 = (double*) malloc(sizeof(double) *m * p);
		sm3 = p;
		
		m4 = (double*) malloc(sizeof(double) *m * p);
		sm4 = p;
		
		m2 = c21;
		sm2 = sC;
		
		m5 = c12;
		sm5 = sC;
		
		m6 = c22;
		sm6 = sC;
		
		
		m7 = c11;
		sm7 = sC;
		
		//m1
		
		sA1 = n;
		sB1 = p;
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		madd_stride(a11,a22,A1,m,n,sA,sA,sA1);
		
		madd_stride(b11,b22,B1,n,p,sB,sB,sB1);
		
		srecmult(A1,B1,m1,m,n,p,sA1,sB1,sm1);
		
		free(A1);
		free(B1);
		
		
		//m2
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a21,a22,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b11,m2,m,n,p,sA1,sB,sm2);
		
		free(A1);
		
		
		//m3
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b12,b22,B1,n,p,sB,sB,sB1);
		srecmult(a11,B1,m3,m,n,p,sA,sB1,sm3);
		
		free(B1);
		
		//m4
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b21,b11,B1,n,p,sB,sB,sB1);
		srecmult(a22,B1,m4,m,n,p,sA,sB1,sm4);
		
		free(B1);
		
		//m5
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a11,a12,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b22,m5,m,n,p,sA1,sB,sm5);
		
		free(A1);
		
		
		//m6
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a21,a11,A1,m,n,sA,sA,sA1);
		madd_stride(b11,b12,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m6,m,n,p,sA1,sB1,sm6);
	
		free(A1);
		free(B1);
		
		//m7
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a12,a22,A1,m,n,sA,sA,sA1);
		madd_stride(b21,b22,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m7,m,n,p,sA1,sB1,sm7);
	
		free(A1);
		free(B1);
		
		
		// c11
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m7,m7,m,p,sm1,sm7,sm7);
		msub_stride(m4,m5,A1,m,p,sm4,sm5,sA1);
		madd_stride(m7,A1,m7,m,p,sm7,sA1,sm7);
		
		free(A1);
		
		
		// c22
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m6,m6,m,p,sm1,sm6,sm6);
		msub_stride(m3,m2,A1,m,p,sm3,sm2,sA1);
		madd_stride(m6,A1,m6,m,p,sm6,sA1,sm6);
		
		free(A1);
		
		//c12 
		
		madd_stride(m3,m5,m5,m,p,sm3,sm5,sm5);
		
		//c21
		
		madd_stride(m4,m2,m2,m,p,sm4,sm2,sm2);
		
		free(m1);
		free(m3);
		free(m4);
	}
}